

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManCancelUntil(Cbs2_Man_t *p,int iBound)

{
  int iVar;
  bool bVar1;
  int local_1c;
  int local_18;
  int iLit;
  int i;
  int iBound_local;
  Cbs2_Man_t *p_local;
  
  if (iBound <= (p->pProp).iTail) {
    (p->pProp).iHead = iBound;
    local_18 = (p->pProp).iHead;
    while( true ) {
      bVar1 = false;
      if (local_18 < (p->pProp).iTail) {
        local_1c = (p->pProp).pData[local_18];
        bVar1 = local_1c != 0;
      }
      if (!bVar1) break;
      iVar = Abc_Lit2Var(local_1c);
      Cbs2_VarUnassign(p,iVar);
      local_18 = local_18 + 1;
    }
    (p->pProp).iTail = iBound;
    return;
  }
  __assert_fail("iBound <= p->pProp.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                ,0x228,"void Cbs2_ManCancelUntil(Cbs2_Man_t *, int)");
}

Assistant:

static inline void Cbs2_ManCancelUntil( Cbs2_Man_t * p, int iBound )
{
    int i, iLit;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
        Cbs2_VarUnassign( p, Abc_Lit2Var(iLit) );
    p->pProp.iTail = iBound;
}